

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTActionEvents.cpp
# Opt level: O3

void TTD::NSLogEvents::JsRTCodeParseAction_UnloadEventMemory
               (EventLogEntry *evt,UnlinkableSlabAllocator *alloc)

{
  bool bVar1;
  
  if (evt->EventKind != CodeParseActionTag) {
    TTDAbort_unrecoverable_error("Bad tag match!");
  }
  SlabAllocatorBase<8>::UnlinkAllocation(alloc,*(void **)(evt + 2));
  bVar1 = IsNullPtrTTString((TTString *)(evt + 3));
  if ((!bVar1) && ((void *)evt[3].EventTimeStamp != (void *)0x0)) {
    SlabAllocatorBase<8>::UnlinkAllocation(alloc,(void *)evt[3].EventTimeStamp);
    return;
  }
  return;
}

Assistant:

void JsRTCodeParseAction_UnloadEventMemory(EventLogEntry* evt, UnlinkableSlabAllocator& alloc)
        {
            JsRTCodeParseAction* cpAction = GetInlineEventDataAs<JsRTCodeParseAction, EventKind::CodeParseActionTag>(evt);

            alloc.UnlinkAllocation(cpAction->SourceCode);

            if(!IsNullPtrTTString(cpAction->SourceUri))
            {
                alloc.UnlinkString(cpAction->SourceUri);
            }
        }